

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

int ifstream_readTextFile(ifstream_t *self,char *filename)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  
  if (filename == (char *)0x0 || self == (ifstream_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = ifstream_readTextFileFromHandle(self,(FILE *)__stream);
      fclose(__stream);
    }
  }
  return iVar1;
}

Assistant:

int ifstream_readTextFile(ifstream_t *self,const char *filename)
{
   int retval = 0;
   if( (self != 0) && (filename != 0) )
   {
      FILE* fh = fopen(filename,"r");
      if (fh != 0)
      {
         retval =  ifstream_readTextFileFromHandle(self, fh);
         fclose(fh);
      }
   }
   else
   {
      retval = -1;
      errno = EINVAL;
   }
   return retval;
}